

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonMonteCarloPricer.cpp
# Opt level: O0

double __thiscall
VarianceSwapsHestonMonteCarloPricer::pathPrice
          (VarianceSwapsHestonMonteCarloPricer *this,vector<double,_std::allocator<double>_> *path,
          double maturity)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  __type _Var4;
  undefined8 local_30;
  size_t i;
  double pathPrice;
  double maturity_local;
  vector<double,_std::allocator<double>_> *path_local;
  VarianceSwapsHestonMonteCarloPricer *this_local;
  
  i = 0;
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(path);
    if (sVar2 - 1 <= local_30) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](path,local_30 + 1);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](path,local_30);
    _Var4 = std::pow<double,int>(dVar1 - *pvVar3,2);
    i = (size_t)(_Var4 + (double)i);
    local_30 = local_30 + 1;
  }
  return ((double)i * 10000.0) / maturity;
}

Assistant:

double VarianceSwapsHestonMonteCarloPricer::pathPrice(std::vector<double> path,
                                                double maturity) const
{
    double pathPrice = 0.0; 
    for(size_t i = 0; i < path.size()-1; i++)
    {   
        pathPrice += std::pow(path[i+1]-path[i],2); //Reminder : path[i] = log(S_ti) 
    }
    return 100*100*pathPrice/maturity;
}